

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

FIOBJ http_urlstr2fiobj(char *s,size_t len)

{
  FIOBJ o;
  size_t size;
  fiobj_object_vtable_s *pfVar1;
  uint uVar2;
  char cVar3;
  fio_str_info_s ret;
  fio_str_info_s local_38;
  
  o = fiobj_str_buf(len);
  if (o == 0) {
LAB_0014bc36:
    local_38.data = anon_var_dwarf_20c;
    local_38.len._0_4_ = 4;
    goto LAB_0014bc49;
  }
  cVar3 = (char)o;
  if ((o & 1) != 0) {
    fio_ltocstr(&local_38,(long)o >> 1);
    goto LAB_0014bc4d;
  }
  switch((uint)o & 6) {
  case 0:
    cVar3 = *(char *)(o & 0xfffffffffffffff8);
LAB_0014bbcf:
    switch(cVar3) {
    case '\'':
      pfVar1 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0014bbc4_caseD_2;
    case ')':
      pfVar1 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0014bbc4_caseD_4;
    case '+':
      pfVar1 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar1 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0014bbc4_caseD_2:
    pfVar1 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0014bbc4_caseD_4:
    pfVar1 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar3 == '&') {
      local_38.data = anon_var_dwarf_217;
      local_38.len._0_4_ = 5;
    }
    else {
      uVar2 = (uint)o & 0xff;
      if (uVar2 != 0x16) {
        if (uVar2 == 6) goto LAB_0014bc36;
        goto LAB_0014bbcf;
      }
      local_38.data = anon_var_dwarf_222;
      local_38.len._0_4_ = 4;
    }
LAB_0014bc49:
    local_38.capa._0_4_ = 0;
    local_38.capa._4_4_ = 0;
    local_38.len._4_4_ = 0;
    goto LAB_0014bc4d;
  }
  (*pfVar1->to_str)(&local_38,o);
LAB_0014bc4d:
  size = http_decode_url(local_38.data,s,len);
  if ((long)size < 0) {
    fiobj_free(o);
    o = fiobj_str_new((char *)0x0,0);
  }
  else {
    fiobj_str_resize(o,size);
  }
  return o;
}

Assistant:

static inline FIOBJ http_urlstr2fiobj(char *s, size_t len) {
  FIOBJ o = fiobj_str_buf(len);
  ssize_t l = http_decode_url(fiobj_obj2cstr(o).data, s, len);
  if (l < 0) {
    fiobj_free(o);
    return fiobj_str_new(NULL, 0); /* empty string */
  }
  fiobj_str_resize(o, (size_t)l);
  return o;
}